

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,unsigned_int>
          (Thread *this)

{
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  unsigned_short *__first;
  unsigned_short *__last;
  unsigned_short local_24 [4];
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  uint val;
  Thread *this_local;
  
  unique0x100000c5 = this;
  result.v._8_4_ = Pop<unsigned_int>(this);
  __first = std::begin<unsigned_short,8ul>((unsigned_short (*) [8])local_24);
  __last = std::end<unsigned_short,8ul>((unsigned_short (*) [8])local_24);
  std::fill<unsigned_short*,unsigned_int>(__first,__last,(uint *)(result.v + 4));
  value.v[4] = result.v[0];
  value.v[5] = result.v[1];
  value.v[6] = result.v[2];
  value.v[7] = result.v[3];
  value.v[0] = local_24[0];
  value.v[1] = local_24[1];
  value.v[2] = local_24[2];
  value.v[3] = local_24[3];
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}